

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

ConfidentialTxOutReference * __thiscall
cfd::ConfidentialTransactionController::AddPegoutTxOut
          (ConfidentialTransactionController *this,Amount *value,ConfidentialAssetId *asset,
          BlockHash *genesisblock_hash,Address *btc_address,NetType net_type,Pubkey *online_pubkey,
          Privkey *master_online_key,string *btc_descriptor,uint32_t bip32_counter,
          ByteData *whitelist,NetType elements_net_type,Address *btc_derive_address)

{
  bool bVar1;
  byte bVar2;
  Amount *in_RSI;
  ConfidentialTxOutReference *in_RDI;
  BlockHash *in_R8;
  Address *in_R9;
  NetType in_stack_00000008;
  Pubkey *in_stack_00000010;
  Privkey *in_stack_00000018;
  string *in_stack_00000020;
  uint32_t in_stack_00000028;
  ByteData *in_stack_00000030;
  NetType in_stack_00000038;
  Address *in_stack_00000040;
  Script locking_script;
  Address derive_addr;
  PegoutKeyData key_data;
  Script script;
  undefined4 in_stack_fffffffffffffc5c;
  Address *in_stack_fffffffffffffc60;
  Script *in_stack_fffffffffffffcd0;
  ConfidentialTransactionController *in_stack_fffffffffffffcd8;
  Script local_2f8;
  Script local_2c0;
  string local_288;
  undefined1 local_268 [72];
  Address local_220;
  PegoutKeyData local_98;
  Script local_68;
  Address *local_30;
  BlockHash *local_28;
  
  local_30 = in_R9;
  local_28 = in_R8;
  core::Script::Script(&local_68);
  core::PegoutKeyData::PegoutKeyData(&local_98);
  bVar1 = core::Pubkey::IsValid(in_stack_00000010);
  if ((!bVar1) || (bVar1 = core::Privkey::IsInvalid(in_stack_00000018), bVar1)) {
    core::Address::GetLockingScript(&local_2f8,local_30);
    core::Script::operator=(&local_68,&local_2f8);
    core::Script::~Script((Script *)in_stack_fffffffffffffc60);
  }
  else {
    core::Address::Address(&local_220);
    core::ByteData::ByteData((ByteData *)local_268);
    in_stack_fffffffffffffc60 = (Address *)local_268;
    core::ConfidentialTransaction::GetPegoutPubkeyData
              ((PegoutKeyData *)(local_268 + 0x18),in_stack_00000010,in_stack_00000018,
               in_stack_00000020,in_stack_00000028,in_stack_00000030,in_stack_00000008,
               (ByteData *)in_stack_fffffffffffffc60,in_stack_00000038,&local_220);
    core::PegoutKeyData::operator=
              ((PegoutKeyData *)in_stack_fffffffffffffc60,
               (PegoutKeyData *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_00000008));
    core::PegoutKeyData::~PegoutKeyData((PegoutKeyData *)(local_268 + 0x18));
    core::ByteData::~ByteData((ByteData *)0x557629);
    core::Address::GetAddress_abi_cxx11_(&local_288,&local_220);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_288);
    if (((bVar2 ^ 0xff) & 1) != 0) {
      core::Address::GetLockingScript(&local_2c0,&local_220);
      core::Script::operator=(&local_68,&local_2c0);
      core::Script::~Script((Script *)in_stack_fffffffffffffc60);
      if (in_stack_00000040 != (Address *)0x0) {
        core::Address::operator=(in_stack_00000040,&local_220);
      }
    }
    core::Address::~Address(in_stack_fffffffffffffc60);
  }
  core::ScriptUtil::CreatePegoutLogkingScript
            ((Script *)&stack0xfffffffffffffcd0,local_28,&local_68,&local_98.btc_pubkey_bytes,
             &local_98.whitelist_proof);
  AddTxOut(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_RSI,(ConfidentialAssetId *)in_RDI)
  ;
  core::Script::~Script((Script *)in_stack_fffffffffffffc60);
  core::PegoutKeyData::~PegoutKeyData(&local_98);
  core::Script::~Script((Script *)in_stack_fffffffffffffc60);
  return in_RDI;
}

Assistant:

const ConfidentialTxOutReference
ConfidentialTransactionController::AddPegoutTxOut(
    const Amount& value, const ConfidentialAssetId& asset,
    const BlockHash& genesisblock_hash, const Address& btc_address,
    NetType net_type, const Pubkey& online_pubkey,
    const Privkey& master_online_key, const std::string& btc_descriptor,
    uint32_t bip32_counter, const ByteData& whitelist,
    NetType elements_net_type, Address* btc_derive_address) {
  Script script;
  PegoutKeyData key_data;
  if (online_pubkey.IsValid() && !master_online_key.IsInvalid()) {
    // generate pubkey and whitelistproof
    Address derive_addr;
    key_data = ConfidentialTransaction::GetPegoutPubkeyData(
        online_pubkey, master_online_key, btc_descriptor, bip32_counter,
        whitelist, net_type, ByteData(), elements_net_type, &derive_addr);
    if (!derive_addr.GetAddress().empty()) {
      script = derive_addr.GetLockingScript();
      if (btc_derive_address != nullptr) {
        *btc_derive_address = derive_addr;
      }
    }
  } else {
    script = btc_address.GetLockingScript();
  }

  Script locking_script = ScriptUtil::CreatePegoutLogkingScript(
      genesisblock_hash, script, key_data.btc_pubkey_bytes,
      key_data.whitelist_proof);

  return AddTxOut(locking_script, value, asset);
}